

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::setIdentifier(CoreBroker *this,string_view name)

{
  BrokerState BVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  
  __svt = in_RDI;
  BVar1 = BrokerBase::getBrokerState((BrokerBase *)0x5cfe25);
  if (BVar1 < CONNECTED) {
    CLI::std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffd0,(mutex_type *)in_RDI);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>(in_RSI,__svt);
    CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x5cfe5e);
  }
  return;
}

Assistant:

void CoreBroker::setIdentifier(std::string_view name)
{
    if (getBrokerState() <= BrokerState::CONNECTING)  // can't be changed after initialization
    {
        const std::lock_guard<std::mutex> lock(name_mutex_);
        identifier.assign(name);
    }
}